

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O1

int handle_frame(int fd,long currcms)

{
  byte *pbVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  bool bVar6;
  __suseconds_t _Var7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  canfd_frame *pcVar15;
  canid_t *pcVar16;
  char *__s;
  long lVar17;
  byte bVar18;
  canfd_frame cf;
  canid_t local_78;
  byte local_74;
  char acStack_70 [64];
  
  bVar18 = 0;
  uVar8 = read(fd,&local_78,0x48);
  if ((int)(uint)uVar8 < 0) {
    __s = "raw read";
LAB_001022bb:
    perror(__s);
    iVar14 = 0;
  }
  else {
    uVar9 = (uint)uVar8 & 0x7fffffff;
    if ((uVar9 != 0x10) && (uVar9 != 0x48)) {
      printf("received strange frame data length %d!\n",uVar8 & 0xffffffff);
      return 0;
    }
    if (canfd_mode == 2) {
      if (uVar9 == 0x10) {
        canfd_mode = 0;
        max_dlen = '\0';
        name_sep = 0;
        print_ascii = 1;
      }
      else {
        canfd_mode = 1;
      }
    }
    iVar14 = 1;
    if (uVar9 == 0x48 && canfd_mode == 0) {
      return 1;
    }
    if (uVar9 == 0x10 && canfd_mode == 1) {
      return 1;
    }
    if ((int)local_78 < 0 && (print_eff & 1) == 0) {
      print_eff = 1;
      clearscreen = 0;
    }
    uVar9 = 0xffffffff;
    if (0 < (long)idx) {
      pcVar15 = &sniftab[0].current;
      lVar13 = 0;
      do {
        if (pcVar15->can_id == local_78) {
          uVar9 = (uint)lVar13;
          break;
        }
        lVar13 = lVar13 + 1;
        pcVar15 = (canfd_frame *)((long)(pcVar15 + 4) + 0x38);
      } while (idx != lVar13);
    }
    if ((int)uVar9 < 0) {
      if (0x7ff < idx) {
        __s = "number of different CAN IDs exceeded MAX_SLOTS";
        goto LAB_001022bb;
      }
      bVar6 = true;
      bVar5 = true;
      uVar10 = idx;
      idx = idx + 1;
    }
    else {
      bVar6 = true;
      bVar5 = true;
      uVar10 = uVar9;
      if (local_74 == sniftab[uVar9].current.len) {
        if ((ulong)local_74 != 0) {
          uVar8 = 0;
          do {
            if (acStack_70[uVar8] != *(char *)((ulong)uVar9 * 0x158 + 0x106208 + uVar8))
            goto LAB_00102333;
            uVar8 = uVar8 + 1;
          } while (local_74 != uVar8);
        }
        bVar6 = false;
        bVar5 = false;
      }
    }
LAB_00102333:
    lVar13 = (long)(int)uVar10;
    lVar11 = lVar13 * 0x158;
    if ((sniftab[lVar13].laststamp.tv_sec == 0) &&
       (bVar5 = true, sniftab[lVar13].laststamp.tv_usec != 0)) {
      bVar5 = bVar6;
    }
    if (bVar5) {
      uVar3 = *(undefined4 *)((long)&sniftab[lVar13].currstamp.tv_sec + 4);
      _Var7 = sniftab[lVar13].currstamp.tv_usec;
      uVar4 = *(undefined4 *)((long)&sniftab[lVar13].currstamp.tv_usec + 4);
      *(int *)&sniftab[lVar13].laststamp.tv_sec = (int)sniftab[lVar13].currstamp.tv_sec;
      *(undefined4 *)((long)&sniftab[lVar13].laststamp.tv_sec + 4) = uVar3;
      *(int *)&sniftab[lVar13].laststamp.tv_usec = (int)_Var7;
      *(undefined4 *)((long)&sniftab[lVar13].laststamp.tv_usec + 4) = uVar4;
      lVar17 = 0;
      ioctl(fd,0x8906,lVar11 + 0x1061a8);
      pcVar16 = &local_78;
      pcVar15 = &sniftab[lVar13].current;
      for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
        uVar2 = *(undefined8 *)pcVar16;
        pcVar15->can_id = (int)uVar2;
        pcVar15->len = (char)((ulong)uVar2 >> 0x20);
        pcVar15->flags = (char)((ulong)uVar2 >> 0x28);
        pcVar15->__res0 = (char)((ulong)uVar2 >> 0x30);
        pcVar15->__res1 = (char)((ulong)uVar2 >> 0x38);
        pcVar16 = (canid_t *)((long)pcVar16 + ((ulong)bVar18 * -2 + 1) * 8);
        pcVar15 = (canfd_frame *)((long)pcVar15 + ((ulong)bVar18 * -2 + 1) * 8);
      }
      lVar12 = 8;
      if (max_dlen != '\0') {
        lVar12 = 0x40;
      }
      do {
        pbVar1 = (byte *)(lVar11 + 0x106250 + lVar17);
        *pbVar1 = *pbVar1 | *(byte *)(lVar11 + 0x1061c0 + lVar17) ^
                            *(byte *)(lVar11 + 0x106208 + lVar17);
        lVar17 = lVar17 + 1;
      } while (lVar12 != lVar17);
      lVar11 = currcms + timeout;
      if (timeout == 0) {
        lVar11 = 0;
      }
      sniftab[lVar13].timeout = lVar11;
      uVar10 = sniftab[lVar13].flags;
      if ((uVar10 & 2) == 0) {
        clearscreen = 0;
      }
      sniftab[lVar13].flags = uVar10 | 6;
    }
    if ((int)uVar9 < 0) {
      qsort(sniftab,(long)idx,0x158,comp);
    }
  }
  return iVar14;
}

Assistant:

int handle_frame(int fd, long currcms)
{
	bool rx_changed = false;
	bool run_qsort = false;
	int nbytes, i, pos;
	struct canfd_frame cf;

	nbytes = read(fd, &cf, sizeof(cf));
	if (nbytes < 0) {
		perror("raw read");
		return 0; /* quit */
	}

	if ((nbytes != CAN_MTU) && (nbytes != CANFD_MTU)) {
		printf("received strange frame data length %d!\n", nbytes);
		return 0; /* quit */
	}

	/* CAN FD auto mode: switch based on first reception */
	if (canfd_mode == CANFD_AUTO) {
		if (nbytes == CAN_MTU) {
			canfd_mode = CANFD_OFF;
			/* change back auto defaults for Classical CAN */
			max_dlen = CAN_MAX_DLEN;
			name_sep = CC_SEP;
			print_ascii = 1;
		} else {
			canfd_mode = CANFD_ON;
		}
	}

	/* filter for Classical CAN */
	if ((canfd_mode == CANFD_OFF) && (nbytes == CANFD_MTU))
		return 1; /* skip handling */

	/* filter for CAN FD */
	if ((canfd_mode == CANFD_ON) && (nbytes == CAN_MTU))
		return 1; /* skip handling */

	if (!print_eff && (cf.can_id & CAN_EFF_FLAG)) {
		print_eff = 1;
		clearscreen = 1;
	}

	pos = sniftab_index(cf.can_id);
	if (pos < 0) {
		/* CAN ID not existing */
		if (idx >= MAX_SLOTS) {
			/* informative exit */
			perror("number of different CAN IDs exceeded MAX_SLOTS");
			return 0; /* quit */
		}
		/* assign new slot */
		pos = idx++;
		rx_changed = true;
		run_qsort = true;
	}
	else {
		if (cf.len == sniftab[pos].current.len)
			for (i = 0; i < cf.len; i++) {
				if (cf.data[i] != sniftab[pos].current.data[i] ) {
					rx_changed = true;
					break;
				}
			}
		else
			rx_changed = true;
	}

	/* print received frame even if the data didn't change to get a gap time */
	if ((sniftab[pos].laststamp.tv_sec == 0) && (sniftab[pos].laststamp.tv_usec == 0))
		rx_changed = true;

	if (rx_changed == true) {
		sniftab[pos].laststamp = sniftab[pos].currstamp;
		ioctl(fd, SIOCGSTAMP, &sniftab[pos].currstamp);

		sniftab[pos].current = cf;
		for (i = 0; i < max_dlen; i++)
			sniftab[pos].marker.data[i] |= sniftab[pos].current.data[i] ^ sniftab[pos].last.data[i];

		sniftab[pos].timeout = (timeout)?(currcms + timeout):0;

		if (is_clr(pos, DISPLAY))
			clearscreen = 1; /* new entry -> new drawing */

		do_set(pos, DISPLAY);
		do_set(pos, UPDATE);
	}

	if (run_qsort == true)
		qsort(sniftab, idx, sizeof(sniftab[0]), comp);

	return 1; /* ok */
}